

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileParser::getMaterialLib(ObjFileParser *this)

{
  byte *pbVar1;
  IOSystem *pIVar2;
  int iVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IOStream *stream;
  Logger *pLVar5;
  undefined4 extraout_var_02;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var6;
  allocator<char> local_8b9;
  vector<char,_std::allocator<char>_> buffer;
  string strMatName;
  string absName;
  ObjFileMtlImporter mtlImporter;
  undefined4 extraout_var_01;
  
  _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  _Var6 = _Var4;
  if ((byte *)_Var4._M_current == pbVar1) {
    return;
  }
  while (((byte *)_Var6._M_current != pbVar1 &&
         ((0xd < (byte)*_Var6._M_current || ((0x3401U >> ((byte)*_Var6._M_current & 0x1f) & 1) == 0)
          )))) {
    (this->m_DataIt)._M_current = (char *)((byte *)_Var6._M_current + 1);
    _Var6._M_current = (char *)((byte *)_Var6._M_current + 1);
  }
  strMatName._M_dataplus._M_p = (pointer)&strMatName.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&strMatName,_Var4._M_current);
  absName._M_dataplus._M_p = (pointer)&absName.field_2;
  absName._M_string_length = 0;
  absName.field_2._M_local_buf[0] = '\0';
  if (strMatName._M_string_length == 0) {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,"OBJ: no name for material library specified.");
  }
  else {
    iVar3 = (*this->m_pIO->_vptr_IOSystem[9])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      std::__cxx11::string::_M_assign((string *)&absName);
    }
    else {
      iVar3 = (*this->m_pIO->_vptr_IOSystem[8])();
      std::__cxx11::string::string((string *)&mtlImporter,(string *)CONCAT44(extraout_var_00,iVar3))
      ;
      if (mtlImporter.m_strAbsPath._M_dataplus._M_p[mtlImporter.m_strAbsPath._M_string_length - 1]
          != '/') {
        std::__cxx11::string::push_back((char)&mtlImporter);
      }
      std::__cxx11::string::append((string *)&absName);
      std::__cxx11::string::append((string *)&absName);
      std::__cxx11::string::~string((string *)&mtlImporter);
    }
    pIVar2 = this->m_pIO;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mtlImporter,"rb",(allocator<char> *)&buffer);
    iVar3 = (*pIVar2->_vptr_IOSystem[4])
                      (pIVar2,absName._M_dataplus._M_p,mtlImporter.m_strAbsPath._M_dataplus._M_p);
    stream = (IOStream *)CONCAT44(extraout_var_01,iVar3);
    std::__cxx11::string::~string((string *)&mtlImporter);
    if (stream == (IOStream *)0x0) {
      pLVar5 = DefaultLogger::get();
      std::operator+(&mtlImporter.m_strAbsPath,"OBJ: Unable to locate material file ",&strMatName);
      Logger::error(pLVar5,mtlImporter.m_strAbsPath._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&mtlImporter);
      std::__cxx11::string::substr((ulong)&buffer,(ulong)&this->m_originalObjFileName);
      std::operator+(&mtlImporter.m_strAbsPath,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                     "mtl");
      std::__cxx11::string::~string((string *)&buffer);
      pLVar5 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                     "OBJ: Opening fallback material file ",&mtlImporter.m_strAbsPath);
      Logger::info(pLVar5,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&buffer);
      pIVar2 = this->m_pIO;
      std::__cxx11::string::string<std::allocator<char>>((string *)&buffer,"rb",&local_8b9);
      iVar3 = (*pIVar2->_vptr_IOSystem[4])
                        (pIVar2,mtlImporter.m_strAbsPath._M_dataplus._M_p,
                         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
      stream = (IOStream *)CONCAT44(extraout_var_02,iVar3);
      std::__cxx11::string::~string((string *)&buffer);
      if (stream == (IOStream *)0x0) {
        pLVar5 = DefaultLogger::get();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                       "OBJ: Unable to locate fallback material file ",&mtlImporter.m_strAbsPath);
        Logger::error(pLVar5,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&buffer);
        _Var6 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                          ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,
                           &this->m_uiLine);
        (this->m_DataIt)._M_current = _Var6._M_current;
        std::__cxx11::string::~string((string *)&mtlImporter);
        goto LAB_0043692d;
      }
      std::__cxx11::string::~string((string *)&mtlImporter);
    }
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer(stream,&buffer,ALLOW_EMPTY);
    (*this->m_pIO->_vptr_IOSystem[5])(this->m_pIO,stream);
    ObjFileMtlImporter::ObjFileMtlImporter
              (&mtlImporter,&buffer,&strMatName,
               (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl);
    ObjFileMtlImporter::~ObjFileMtlImporter(&mtlImporter);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  }
LAB_0043692d:
  std::__cxx11::string::~string((string *)&absName);
  std::__cxx11::string::~string((string *)&strMatName);
  return;
}

Assistant:

void ObjFileParser::getMaterialLib() {
    // Translate tuple
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // Check for existence
    const std::string strMatName(pStart, &(*m_DataIt));
    std::string absName;

	// Check if directive is valid.
    if ( 0 == strMatName.length() ) {
        ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
        return;
    }

    if ( m_pIO->StackSize() > 0 ) {
        std::string path = m_pIO->CurrentDirectory();
        if ( '/' != *path.rbegin() ) {
          path += '/';
        }
        absName += path;
        absName += strMatName;
    } else {
        absName = strMatName;
    }

    IOStream *pFile = m_pIO->Open( absName );
    if ( nullptr == pFile ) {
        ASSIMP_LOG_ERROR("OBJ: Unable to locate material file " + strMatName);
        std::string strMatFallbackName = m_originalObjFileName.substr(0, m_originalObjFileName.length() - 3) + "mtl";
        ASSIMP_LOG_INFO("OBJ: Opening fallback material file " + strMatFallbackName);
        pFile = m_pIO->Open(strMatFallbackName);
        if (!pFile) {
            ASSIMP_LOG_ERROR("OBJ: Unable to locate fallback material file " + strMatFallbackName);
            m_DataIt = skipLine<DataArrayIt>(m_DataIt, m_DataItEnd, m_uiLine);
            return;
        }
    }

    // Import material library data from file.
    // Some exporters (e.g. Silo) will happily write out empty
    // material files if the model doesn't use any materials, so we
    // allow that.
    std::vector<char> buffer;
    BaseImporter::TextFileToBuffer( pFile, buffer, BaseImporter::ALLOW_EMPTY );
    m_pIO->Close( pFile );

    // Importing the material library
    ObjFileMtlImporter mtlImporter( buffer, strMatName, m_pModel.get() );
}